

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsTestDriver.cpp
# Opt level: O0

bool __thiscall
xs::TestDriver::writeMessage(TestDriver *this,ByteBuffer *messageBuffer,Message *message)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference elemBuf;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  Message *message_local;
  ByteBuffer *messageBuffer_local;
  TestDriver *this_local;
  
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)message;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  (**(code **)(*(long *)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 0x10))
            (buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  iVar2 = de::RingBuffer<unsigned_char>::getNumFree(messageBuffer);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  bVar1 = (int)sVar3 <= iVar2;
  if (bVar1) {
    elemBuf = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    de::RingBuffer<unsigned_char>::pushFront(messageBuffer,elemBuf,(int)sVar3);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return bVar1;
}

Assistant:

bool TestDriver::writeMessage (ByteBuffer& messageBuffer, const Message& message)
{
	vector<deUint8> buf;
	message.write(buf);

	if (messageBuffer.getNumFree() < (int)buf.size())
		return false;

	messageBuffer.pushFront(&buf[0], (int)buf.size());
	return true;
}